

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

void CVmPack::parse_type(CVmPackPos *p,CVmPackType *info,CVmPackGroup *group)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  wchar_t wVar4;
  void *pvVar5;
  uint uVar6;
  
  wVar4 = CVmPackPos::nextch(p);
  if ((wVar4 < L'\x80') &&
     (pvVar5 = memchr("aAbuUwWhHcCsSlLqQkfdxX@\"{",(int)(char)wVar4,0x1a), pvVar5 != (void *)0x0)) {
    info->fmtidx = p->idx + -1;
    info->type_code = wVar4;
    if (wVar4 == L'{') {
      (info->lit).p.p_ = (p->p).p_;
      (info->lit).len = p->len;
      (info->lit).idx = p->idx;
      CVmPackPos::getch(p);
      sVar2 = p->len;
      while (sVar2 != 0) {
        wVar4 = CVmPackPos::getch(p);
        if (wVar4 == L'}') {
          psVar1 = &(info->lit).len;
          *psVar1 = *psVar1 - p->len;
          CVmPackPos::inc(p);
          goto LAB_0027be44;
        }
        wVar4 = CVmPackPos::getch(p);
        if ((0x7f < (uint)wVar4) ||
           (((uint)(wVar4 + L'\xffffffc6') < 0xfffffff6 &&
            ((0x25 < (uint)(wVar4 + L'\xffffffbf') ||
             ((0x3f0000003fU >> ((ulong)(uint)(wVar4 + L'\xffffffbf') & 0x3f) & 1) == 0)))))) {
          err_throw_a(0x6b,0,(ulong)(uint)p->idx);
        }
        CVmPackPos::inc(p);
        CVmPackPos::getch(p);
        sVar2 = p->len;
      }
    }
    else {
      if (wVar4 != L'\"') {
LAB_0027be44:
        info->big_endian = group->big_endian;
        info->tilde = group->tilde;
        info->pct = group->pct;
        info->count = -1;
        info->count_in_bytes = 0;
        info->count_as_type = L'\0';
        info->qu = 0;
        info->null_term = 0;
        info->bang = 0;
        parse_mods(p,info);
        return;
      }
      (info->lit).p.p_ = (p->p).p_;
      (info->lit).len = p->len;
      (info->lit).idx = p->idx;
      while (CVmPackPos::getch(p), p->len != 0) {
        wVar4 = CVmPackPos::getch(p);
        if (wVar4 == L'\"') {
          sVar2 = (info->lit).len;
          sVar3 = p->len;
          CVmPackPos::inc(p);
          wVar4 = CVmPackPos::getch(p);
          if (wVar4 != L'\"') {
            (info->lit).len = sVar2 - sVar3;
            goto LAB_0027be44;
          }
        }
        CVmPackPos::inc(p);
      }
    }
    uVar6 = p->idx;
  }
  else {
    uVar6 = p->idx - 1;
  }
  err_throw_a(0x6b,1,0,(ulong)uVar6);
}

Assistant:

void CVmPack::parse_type(CVmPackPos *p, CVmPackType *info,
                         const CVmPackGroup *group)
{
    /* get the type code */
    wchar_t c = p->nextch();
    if (!is_valid_type(c))
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index() - 1);

    /* set the format string index */
    info->fmtidx = p->index() - 1;

    /* this is the type code - save it */
    info->type_code = c;

    /* 
     *   if it's a quote, parse the characters to the next quote; if it's an
     *   open brace, parse the hex digits to the close brace 
     */
    if (c == '"')
    {
        /* note the start of the literal section */
        info->lit.set(p);
        
        /* scan for the closing quote */
        for ( ; ; p->inc())
        {
            /* if at end of string, it's an error */
            if (!p->more())
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());

            /* check for the close quote */
            if (p->getch() == '"')
            {
                /* this might be it - note the length if so */
                size_t len = info->lit.len - p->len;

                /* skip it */
                p->inc();

                /* if it's not a stuttered quote, it's really the end */
                if (p->getch() != '"')
                {
                    info->lit.len = len;
                    break;
                }
            }
        }
    }
    else if (c == '{')
    {
        /* note the start of the literal section */
        info->lit.set(p);
        
        /* scan for the closing brace - only hex digits are allowed */
        for ( ; ; p->inc())
        {
            /* if at end of string, it's an error */
            if (!p->more())
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());

            /* make sure it's a hex digit or close brace */
            if (p->getch() == '}')
            {
                /* it's the close brace - note it, skip it, and we're done */
                info->lit.len -= p->len;
                p->inc();
                break;
            }
            else if (!is_xdigit(p->getch()))
                err_throw_a(VMERR_PACK_PARSE, ERR_TYPE_INT, p->index());
        }
    }

    /* set the default modifiers */
    info->big_endian = group->big_endian;
    info->tilde = group->tilde;
    info->pct = group->pct;
    info->count = ITER_NONE;
    info->count_as_type = 0;
    info->count_in_bytes = FALSE;
    info->bang = info->qu = FALSE;
    info->null_term = FALSE;

    /* check for modifiers */
    parse_mods(p, info);
}